

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallProgramsCommand.cxx
# Opt level: O3

bool cmInstallProgramsCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmMakefile *this;
  pointer pbVar1;
  pointer pcVar2;
  cmGlobalGenerator *pcVar3;
  string *component;
  string *psVar4;
  ulong uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  finalArgs;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  _Any_data local_d8;
  code *local_c8;
  undefined8 uStack_c0;
  __uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_b8 [2];
  string *local_a8;
  undefined8 uStack_a0;
  code *local_98;
  undefined8 uStack_90;
  long *local_80;
  long local_78;
  long local_70 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  uVar5 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (uVar5 < 0x21) {
    local_f8._M_unused._M_object = &local_e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((code **)local_f8._M_unused._0_8_ != &local_e8) {
      operator_delete(local_f8._M_unused._M_object,(ulong)(local_e8 + 1));
    }
  }
  else {
    this = status->Makefile;
    pcVar3 = cmMakefile::GetGlobalGenerator(this);
    cmGlobalGenerator::EnableInstallTarget(pcVar3);
    pcVar3 = cmMakefile::GetGlobalGenerator(this);
    local_f8._M_unused._M_object = &local_e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"CMAKE_INSTALL_DEFAULT_COMPONENT_NAME","");
    component = cmMakefile::GetSafeDefinition(this,(string *)&local_f8);
    cmGlobalGenerator::AddInstallComponent(pcVar3,component);
    if ((code **)local_f8._M_unused._0_8_ != &local_e8) {
      operator_delete(local_f8._M_unused._M_object,(ulong)(local_e8 + 1));
    }
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               pbVar1 + 1,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)local_f8._M_pod_data);
    pcVar2 = (pbVar1->_M_dataplus)._M_p;
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar2,pcVar2 + pbVar1->_M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_60,&local_48);
    local_98 = (code *)0x0;
    uStack_90 = 0;
    local_a8 = (string *)0x0;
    uStack_a0 = 0;
    psVar4 = (string *)operator_new(0x38);
    *(string **)psVar4 = psVar4 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar4,local_80,local_78 + (long)local_80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(psVar4 + 0x20),&local_60);
    local_e0 = std::
               _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallProgramsCommand.cxx:42:5)>
               ::_M_invoke;
    local_f8._8_8_ = uStack_a0;
    local_e8 = std::
               _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallProgramsCommand.cxx:42:5)>
               ::_M_manager;
    local_98 = (code *)0x0;
    uStack_90 = 0;
    local_c8 = (code *)0x0;
    uStack_c0 = 0;
    local_d8._M_unused._M_object = (void *)0x0;
    local_d8._8_8_ = 0;
    local_b8[0]._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
         (_Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)0x0;
    local_f8._M_unused._0_8_ = (undefined8)psVar4;
    local_a8 = psVar4;
    cmMakefile::AddGeneratorAction(this,(GeneratorAction *)&local_f8);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_b8);
    if (local_c8 != (code *)0x0) {
      (*local_c8)(&local_d8,&local_d8,__destroy_functor);
    }
    if (local_e8 != (code *)0x0) {
      (*local_e8)(&local_f8,&local_f8,3);
    }
    if (local_98 != (code *)0x0) {
      (*local_98)(&local_a8,&local_a8,3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  return 0x20 < uVar5;
}

Assistant:

bool cmInstallProgramsCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // Enable the install target.
  mf.GetGlobalGenerator()->EnableInstallTarget();

  mf.GetGlobalGenerator()->AddInstallComponent(
    mf.GetSafeDefinition("CMAKE_INSTALL_DEFAULT_COMPONENT_NAME"));

  std::string const& dest = args[0];
  std::vector<std::string> const finalArgs(args.begin() + 1, args.end());
  mf.AddGeneratorAction(
    [dest, finalArgs](cmLocalGenerator& lg, const cmListFileBacktrace&) {
      FinalAction(*lg.GetMakefile(), dest, finalArgs);
    });
  return true;
}